

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O0

void Cmd_net_removecontroller(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *__nptr;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  if (netgame) {
    iVar1 = FCommandLine::argc(argv);
    if (iVar1 < 2) {
      Printf("Usage: net_removecontroller <player>\n");
    }
    else {
      __nptr = FCommandLine::operator[](argv,1);
      iVar1 = atoi(__nptr);
      Network_Controller(iVar1,false);
    }
  }
  else {
    Printf("This command can only be used when playing a net game.\n");
  }
  return;
}

Assistant:

CCMD (net_removecontroller)
{
	if (!netgame)
	{
		Printf ("This command can only be used when playing a net game.\n");
		return;
	}

	if (argv.argc () < 2)
	{
		Printf ("Usage: net_removecontroller <player>\n");
		return;
	}

	Network_Controller (atoi (argv[1]), false);
}